

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edge-segments.cpp
# Opt level: O2

void __thiscall
msdfgen::QuadraticSegment::QuadraticSegment
          (QuadraticSegment *this,Point2 p0,Point2 p1,Point2 p2,EdgeColor edgeColor)

{
  bool bVar1;
  long lVar2;
  Vector2 VVar3;
  Vector2 local_50;
  Point2 p2_local;
  Point2 p0_local;
  Vector2 local_20;
  
  p2_local.y = p2.y;
  p2_local.x = p2.x;
  local_50.y = p1.y;
  local_50.x = p1.x;
  p0_local.y = p0.y;
  p0_local.x = p0.x;
  (this->super_EdgeSegment).color = edgeColor;
  (this->super_EdgeSegment)._vptr_EdgeSegment = (_func_int **)&PTR__EdgeSegment_001ad2c0;
  lVar2 = 0x10;
  do {
    Vector2::Vector2((Vector2 *)
                     ((long)&(((QuadraticSegment *)(this->p + -1))->super_EdgeSegment).
                             _vptr_EdgeSegment + lVar2),0.0);
    lVar2 = lVar2 + 0x10;
  } while (lVar2 != 0x40);
  bVar1 = Vector2::operator==(&local_50,&p0_local);
  if (!bVar1) {
    bVar1 = Vector2::operator==(&local_50,&p2_local);
    if (!bVar1) goto LAB_001676f7;
  }
  VVar3 = Vector2::operator+(&p0_local,&p2_local);
  local_20.y = VVar3.y;
  local_20.x = VVar3.x;
  VVar3 = operator*(0.5,&local_20);
  local_50.y = VVar3.y;
  local_50.x = VVar3.x;
LAB_001676f7:
  this->p[0].x = p0_local.x;
  this->p[0].y = p0_local.y;
  this->p[1].x = local_50.x;
  this->p[1].y = local_50.y;
  this->p[2].x = p2_local.x;
  this->p[2].y = p2_local.y;
  return;
}

Assistant:

QuadraticSegment::QuadraticSegment(Point2 p0, Point2 p1, Point2 p2, EdgeColor edgeColor) : EdgeSegment(edgeColor) {
    if (p1 == p0 || p1 == p2)
        p1 = 0.5*(p0+p2);
    p[0] = p0;
    p[1] = p1;
    p[2] = p2;
}